

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O1

void __thiscall
soplex::LPColSetBase<double>::LPColSetBase(LPColSetBase<double> *this,int pmax,int pmemmax)

{
  SVSetBase<double>::SVSetBase(&this->super_SVSetBase<double>,pmax,pmemmax,1.1,1.2);
  (this->super_SVSetBase<double>).super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray =
       (_func_int **)&PTR__LPColSetBase_003b14a8;
  VectorBase<double>::VectorBase(&this->low,0);
  VectorBase<double>::VectorBase(&this->up,0);
  VectorBase<double>::VectorBase(&this->object,0);
  (this->scaleExp).data = (int *)0x0;
  (this->scaleExp).memFactor = 1.2;
  (this->scaleExp).thesize = 0;
  (this->scaleExp).themax = 1;
  spx_alloc<int*>(&(this->scaleExp).data,1);
  return;
}

Assistant:

explicit
   LPColSetBase(int pmax = -1, int pmemmax = -1)
      : SVSetBase<R>(pmax, pmemmax), low(0), up(0), object(0), scaleExp(0)
   {
      assert(isConsistent());
   }